

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase157::run(TestCase157 *this)

{
  TestElement *pTVar1;
  Maybe<kj::(anonymous_namespace)::TestElement_&> MVar2;
  bool result;
  LogSeverity severity;
  LogSeverity extraout_EDX;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  char *in_R8;
  DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
  *in_R9;
  bool bVar4;
  Fault f;
  DebugComparison<int_&,_int> _kjCondition;
  Iterator iter;
  TestElement baz;
  Fault in_stack_ffffffffffffff38;
  DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
  local_c0;
  ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
  local_90;
  TestElement local_80;
  TestElement local_68;
  List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
  local_50;
  TestElement local_38;
  
  local_38.link.prev = &local_68.link.next;
  local_68.i = 0x7b;
  local_50.head.ptr = &local_68;
  local_68.link.prev = &local_50.head;
  local_80.link.prev = &local_38.link.next;
  local_38.i = 0x1c8;
  local_68.link.next.ptr = &local_38;
  local_50.tail = &local_80.link.next;
  local_80.i = 0x315;
  local_80.link.next.ptr = (TestElement *)0x0;
  local_90.next.ptr = &local_80;
  local_50.listSize = 3;
  local_38.link.next.ptr = local_90.next.ptr;
  List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>::
  remove((List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
          *)local_68.link.prev,(char *)local_68.link.next.ptr);
  local_90.current.ptr = local_90.next.ptr;
  if (local_90.next.ptr == (TestElement *)0x0) {
    pTVar1 = (TestElement *)0x0;
  }
  else {
    pTVar1 = ((local_90.next.ptr)->link).next.ptr;
  }
  local_c0.right.current.ptr = (TestElement *)0x0;
  local_c0.right.next.ptr = (TestElement *)0x0;
  local_c0.op.content.ptr = " != ";
  local_c0.op.content.size_ = 5;
  local_c0.result = local_90.next.ptr != (TestElement *)0x0;
  if (local_90.next.ptr == (TestElement *)0x0) {
    local_c0.left = &local_90;
    local_90.next.ptr = pTVar1;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>>&>
              ((Fault *)&stack0xffffffffffffff38,(char *)0xbb,0x1c82cb,(Type)&local_c0,in_R8,
               (char *)in_R9,
               (DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
                *)in_stack_ffffffffffffff38.exception);
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff38);
  }
  uVar3 = 0x315;
  bVar4 = (local_90.next.ptr)->i == 0x315;
  local_c0.left =
       (ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
        *)local_90.next.ptr;
  local_c0.right.current.ptr = (TestElement *)&DAT_00000315;
  local_c0.right.next.ptr = (TestElement *)0x1c31cf;
  local_c0.op.content.ptr = &DAT_00000005;
  local_c0.op.content.size_ = (size_t)bVar4;
  local_90.next.ptr = pTVar1;
  if ((!bVar4) && (_::Debug::minSeverity < 3)) {
    in_R8 = "failed: expected iter->i == 789";
    in_R9 = &local_c0;
    _::Debug::log<char_const(&)[32],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xbc,ERROR,"\"failed: expected \" \"iter->i == 789\", _kjCondition",
               (char (*) [32])"failed: expected iter->i == 789",(DebugComparison<int_&,_int> *)in_R9
              );
    uVar3 = extraout_RDX;
  }
  if (local_90.next.ptr == (TestElement *)0x0) {
    MVar2.ptr = (TestElement *)0x0;
  }
  else {
    MVar2.ptr = ((local_90.next.ptr)->link).next.ptr;
  }
  local_c0.result = local_90.next.ptr == (TestElement *)0x0;
  local_c0.right.current.ptr = (TestElement *)0x0;
  local_c0.right.next.ptr = (TestElement *)0x0;
  local_c0.op.content.ptr = " == ";
  local_c0.op.content.size_ = 5;
  local_c0.left = &local_90;
  local_90.current.ptr = local_90.next.ptr;
  if (2 >= _::Debug::minSeverity && !local_c0.result) {
    local_90.next.ptr = MVar2.ptr;
    _::Debug::
    log<char_const(&)[36],kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>>&>
              ((char *)0xbf,(int)&local_c0,
               (LogSeverity)CONCAT71((int7)((ulong)uVar3 >> 8),local_c0.result),
               (char *)CONCAT71((int7)((ulong)MVar2.ptr >> 8),
                                2 < _::Debug::minSeverity || local_c0.result),(char (*) [36])in_R8,
               in_R9);
    MVar2.ptr = local_90.next.ptr;
  }
  local_90.next.ptr = MVar2.ptr;
  if (_::Debug::minSeverity < 3 &&
      (List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link> *
      )local_68.link.prev ==
      (List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link> *
      )0x0) {
    in_R8 = "failed: expected foo.link.isLinked()";
    in_R9 = &local_c0;
    local_c0.left._0_1_ =
         (List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
          *)local_68.link.prev !=
         (List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
          *)0x0;
    _::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xc2,ERROR,"\"failed: expected \" \"foo.link.isLinked()\", _kjCondition",
               (char (*) [37])"failed: expected foo.link.isLinked()",(DebugExpression<bool> *)in_R9)
    ;
  }
  local_c0.left._0_1_ =
       (ListLink<kj::(anonymous_namespace)::TestElement> *)local_38.link.prev ==
       (ListLink<kj::(anonymous_namespace)::TestElement> *)0x0;
  if (_::Debug::minSeverity < 3 && !(bool)local_c0.left._0_1_) {
    in_R8 = "failed: expected !bar.link.isLinked()";
    in_R9 = &local_c0;
    _::Debug::log<char_const(&)[38],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xc3,ERROR,"\"failed: expected \" \"!bar.link.isLinked()\", _kjCondition",
               (char (*) [38])"failed: expected !bar.link.isLinked()",(DebugExpression<bool> *)in_R9
              );
  }
  local_c0.left =
       (ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
        *)CONCAT71(local_c0.left._1_7_,
                   (ListLink<kj::(anonymous_namespace)::TestElement> *)local_80.link.prev !=
                   (ListLink<kj::(anonymous_namespace)::TestElement> *)0x0);
  if (((ListLink<kj::(anonymous_namespace)::TestElement> *)local_80.link.prev ==
       (ListLink<kj::(anonymous_namespace)::TestElement> *)0x0) && (_::Debug::minSeverity < 3)) {
    in_R8 = "failed: expected baz.link.isLinked()";
    in_R9 = &local_c0;
    _::Debug::log<char_const(&)[37],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xc4,ERROR,"\"failed: expected \" \"baz.link.isLinked()\", _kjCondition",
               (char (*) [37])"failed: expected baz.link.isLinked()",(DebugExpression<bool> *)in_R9)
    ;
  }
  local_90.current.ptr = local_50.head.ptr;
  if (local_50.head.ptr == (TestElement *)0x0) {
    local_90.next.ptr = (TestElement *)0x0;
  }
  else {
    local_90.next.ptr = ((local_50.head.ptr)->link).next.ptr;
  }
  local_c0.right.current.ptr = (TestElement *)0x0;
  local_c0.right.next.ptr = (TestElement *)0x0;
  local_c0.op.content.ptr = " != ";
  local_c0.op.content.size_ = 5;
  local_c0.result = local_50.head.ptr != (TestElement *)0x0;
  if (local_50.head.ptr == (TestElement *)0x0) {
    local_c0.left = &local_90;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>>&>
              ((Fault *)&stack0xffffffffffffff38,(char *)0xc8,0x1c82cb,(Type)&local_c0,in_R8,
               (char *)in_R9,
               (DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
                *)in_stack_ffffffffffffff38.exception);
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff38);
  }
  bVar4 = (local_50.head.ptr)->i == 0x7b;
  local_c0.left =
       (ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
        *)local_50.head.ptr;
  local_c0.right.current.ptr = (TestElement *)0x7b;
  local_c0.right.next.ptr = (TestElement *)0x1c31cf;
  local_c0.op.content.ptr = &DAT_00000005;
  local_c0.op.content.size_ = (size_t)bVar4;
  if ((!bVar4) && (_::Debug::minSeverity < 3)) {
    in_R8 = "failed: expected iter->i == 123";
    in_R9 = &local_c0;
    _::Debug::log<char_const(&)[32],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xc9,ERROR,"\"failed: expected \" \"iter->i == 123\", _kjCondition",
               (char (*) [32])"failed: expected iter->i == 123",(DebugComparison<int_&,_int> *)in_R9
              );
  }
  if (local_90.next.ptr == (TestElement *)0x0) {
    pTVar1 = (TestElement *)0x0;
  }
  else {
    pTVar1 = ((local_90.next.ptr)->link).next.ptr;
  }
  local_c0.right.current.ptr = (TestElement *)0x0;
  local_c0.right.next.ptr = (TestElement *)0x0;
  local_c0.op.content.ptr = " != ";
  local_c0.op.content.size_ = 5;
  local_c0.result = local_90.next.ptr != (TestElement *)0x0;
  if (local_90.next.ptr == (TestElement *)0x0) {
    local_c0.left = &local_90;
    local_90.current.ptr = local_90.next.ptr;
    local_90.next.ptr = pTVar1;
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>>&>
              ((Fault *)&stack0xffffffffffffff38,(char *)0xcc,0x1c82cb,(Type)&local_c0,in_R8,
               (char *)in_R9,
               (DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_&,_kj::ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>_>
                *)in_stack_ffffffffffffff38.exception);
    _::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff38);
  }
  severity = 0x315;
  bVar4 = (local_90.next.ptr)->i == 0x315;
  local_c0.right.current.ptr = (TestElement *)&DAT_00000315;
  local_c0.right.next.ptr = (TestElement *)0x1c31cf;
  local_c0.op.content.ptr = &DAT_00000005;
  local_c0.op.content.size_ = (size_t)bVar4;
  local_90.current.ptr = pTVar1;
  if ((!bVar4) && (_::Debug::minSeverity < 3)) {
    in_R8 = "failed: expected iter->i == 789";
    in_R9 = &local_c0;
    local_c0.left =
         (ListIterator<kj::(anonymous_namespace)::TestElement,_kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>
          *)local_90.next.ptr;
    local_90.current.ptr = local_90.next.ptr;
    local_90.next.ptr = pTVar1;
    _::Debug::log<char_const(&)[32],kj::_::DebugComparison<int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/list-test.c++"
               ,0xcd,ERROR,"\"failed: expected \" \"iter->i == 789\", _kjCondition",
               (char (*) [32])"failed: expected iter->i == 789",(DebugComparison<int_&,_int> *)in_R9
              );
    local_90.current.ptr = local_90.next.ptr;
    severity = extraout_EDX;
  }
  if (local_90.current.ptr == (TestElement *)0x0) {
    local_90.next.ptr = (TestElement *)0x0;
  }
  else {
    local_90.next.ptr = ((local_90.current.ptr)->link).next.ptr;
  }
  local_c0.right.current.ptr = (TestElement *)0x0;
  local_c0.right.next.ptr = (TestElement *)0x0;
  local_c0.op.content.ptr = " == ";
  local_c0.op.content.size_ = 5;
  local_c0.result = local_90.current.ptr == (TestElement *)0x0;
  local_c0.left = &local_90;
  if ((!local_c0.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::
    log<char_const(&)[36],kj::_::DebugComparison<kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>&,kj::ListIterator<kj::(anonymous_namespace)::TestElement,kj::(anonymous_namespace)::TestElement,&kj::(anonymous_namespace)::TestElement::link>>&>
              ((char *)0xd0,(int)&local_c0,severity,(char *)local_90.current.ptr,
               (char (*) [36])in_R8,in_R9);
  }
  List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>::
  remove(&local_50,(char *)&local_80);
  if ((ListLink<kj::(anonymous_namespace)::TestElement> *)local_80.link.prev !=
      (ListLink<kj::(anonymous_namespace)::TestElement> *)0x0) {
    _::throwDestroyedWhileInList();
  }
  if ((ListLink<kj::(anonymous_namespace)::TestElement> *)local_38.link.prev !=
      (ListLink<kj::(anonymous_namespace)::TestElement> *)0x0) {
    _::throwDestroyedWhileInList();
  }
  List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link>::
  remove(&local_50,(char *)&local_68);
  if ((List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link> *
      )local_68.link.prev ==
      (List<kj::(anonymous_namespace)::TestElement,_&kj::(anonymous_namespace)::TestElement::link> *
      )0x0) {
    return;
  }
  _::throwDestroyedWhileInList();
}

Assistant:

TestElement(int i): i(i) {}